

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-database_storing.c
# Opt level: O0

greatest_test_res db_all_fare_rules_store(void)

{
  uint uVar1;
  undefined1 local_40 [4];
  int stored_count;
  feed_db_t db;
  FILE *fp;
  
  db._32_8_ = fopen("../tests/data/stupid_gtfs/fare_rules.txt","r");
  if ((FILE *)db._32_8_ == (FILE *)0x0) {
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_storing.c"
    ;
    greatest_info.fail_line = 0x5f;
    greatest_info.msg = "Couldn\'t open `data/stupid_gtfs/fare_rules.txt` test file";
    if ((greatest_info.flags & 4) != 0) {
      abort();
    }
    fp._4_4_ = GREATEST_TEST_RES_FAIL;
  }
  else {
    init_feed_db((feed_db_t *)local_40,"tests_storing.db",1);
    setup_feed_db((feed_db_t *)local_40);
    uVar1 = store_all_fare_rules_db((FILE *)db._32_8_,(feed_db_t *)local_40);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (uVar1 == 4) {
      free_feed_db((feed_db_t *)local_40);
      if (db._32_8_ != 0) {
        fclose((FILE *)db._32_8_);
      }
      greatest_info.msg = (char *)0x0;
      fp._4_4_ = GREATEST_TEST_RES_PASS;
    }
    else {
      fprintf(_stdout,"\nExpected: ");
      fprintf(_stdout,"%i",4);
      fprintf(_stdout,"\n     Got: ");
      fprintf(_stdout,"%i",(ulong)uVar1);
      fprintf(_stdout,"\n");
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-database_storing.c"
      ;
      greatest_info.fail_line = 0x69;
      greatest_info.msg = "4 != stored_count";
      if ((greatest_info.flags & 4) != 0) {
        abort();
      }
      fp._4_4_ = GREATEST_TEST_RES_FAIL;
    }
  }
  return fp._4_4_;
}

Assistant:

TEST db_all_fare_rules_store(void) {
    FILE *fp = fopen("../tests/data/stupid_gtfs/fare_rules.txt", "r");
    if (fp == NULL) {
        FAILm("Couldn't open `data/stupid_gtfs/fare_rules.txt` test file");
    } else {

        feed_db_t db;
        // feed_db_status_t res;

        /* res = */ init_feed_db(&db, "tests_storing.db", 1);
        /* res = */ setup_feed_db(&db);

        int stored_count = store_all_fare_rules_db(fp, &db);
        ASSERT_EQ_FMT(4, stored_count, "%i");

        free_feed_db(&db);
        if (fp) fclose(fp);
    }
    PASS();
}